

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
          (ExtensionSet *this,int number,int index)

{
  byte bVar1;
  _Base_ptr p_Var2;
  LogMessage *pLVar3;
  Type *pTVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  LogFinisher local_109;
  LogMessage local_108;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var6->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < number]) {
    if (number <= (int)p_Var5[1]._M_color) {
      p_Var2 = p_Var5;
    }
  }
  p_Var5 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var6) && (p_Var5 = p_Var2, number < (int)p_Var2[1]._M_color))
  {
    p_Var5 = &p_Var6->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var6) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x207);
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)&local_108,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x208);
    pLVar3 = LogMessage::operator<<
                       (&local_98,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=((LogFinisher *)&local_108,pLVar3);
    LogMessage::~LogMessage(&local_98);
  }
  bVar1 = *(byte *)&p_Var5[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar3 = LogMessage::operator<<
                       (&local_108,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_d0,pLVar3);
    LogMessage::~LogMessage(&local_108);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
    LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x208);
    pLVar3 = LogMessage::operator<<
                       (&local_d0,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_STRING): "
                       );
    LogFinisher::operator=(&local_109,pLVar3);
    LogMessage::~LogMessage(&local_d0);
  }
  pTVar4 = RepeatedPtrFieldBase::
           Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     ((RepeatedPtrFieldBase *)p_Var5[1]._M_parent,index);
  return pTVar4;
}

Assistant:

string* ExtensionSet::MutableRepeatedString(int number, int index) {
  ExtensionMap::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, STRING);
  return iter->second.repeated_string_value->Mutable(index);
}